

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

VkPipelineColorBlendStateCreateInfo * __thiscall
Fossilize::StateRecorder::Impl::copy<VkPipelineColorBlendStateCreateInfo>
          (Impl *this,VkPipelineColorBlendStateCreateInfo *src,size_t count,ScratchAllocator *alloc)

{
  VkPipelineColorBlendStateCreateInfo *new_data;
  ScratchAllocator *alloc_local;
  size_t count_local;
  VkPipelineColorBlendStateCreateInfo *src_local;
  Impl *this_local;
  
  if (count == 0) {
    this_local = (Impl *)0x0;
  }
  else {
    this_local = (Impl *)ScratchAllocator::allocate_n<VkPipelineColorBlendStateCreateInfo>
                                   (alloc,count);
    if (this_local != (Impl *)0x0) {
      std::copy<VkPipelineColorBlendStateCreateInfo_const*,VkPipelineColorBlendStateCreateInfo*>
                (src,src + count,(VkPipelineColorBlendStateCreateInfo *)this_local);
    }
  }
  return (VkPipelineColorBlendStateCreateInfo *)this_local;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}